

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall Am_Object::~Am_Object(Am_Object *this)

{
  bool bVar1;
  ostream *poVar2;
  Am_Object *this_local;
  
  if (this->data != (Am_Object_Data *)0x0) {
    bVar1 = Am_Wrapper::Is_Zero(&this->data->super_Am_Wrapper);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar2 = std::operator<<(poVar2,"** Tried to delete object twice.");
      poVar2 = ::operator<<(poVar2,this);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    Am_Wrapper::Release(&this->data->super_Am_Wrapper);
  }
  this->data = (Am_Object_Data *)0x0;
  return;
}

Assistant:

Am_Object::~Am_Object()
{
  if (data) {
    if (data->Is_Zero())
      Am_ERROR("** Tried to delete object twice." << *this);
    data->Release();
  }
  data = nullptr;
}